

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<kj::(anonymous_namespace)::TestCase217::run()::__0>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_1_0_00000001 *func)

{
  anon_class_1_0_00000001 *func_local;
  
  anon_unknown_0::TestCase217::run::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}